

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall CDirectiveFile::CDirectiveFile(CDirectiveFile *this,Type type,ArgumentList *args)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  long lVar2;
  bool bVar3;
  GenericAssemblerFile *this_00;
  wchar_t *text;
  pointer strFilename;
  int virtualAddress;
  wstring fileName;
  wstring originalName;
  u32 local_94;
  wstring local_90;
  undefined1 local_70 [32];
  wstring local_50;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CAssemblerCommand_001729d0;
  this->type = type;
  this->file = (GenericAssemblerFile *)0x0;
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = L'\0';
  lVar2 = (long)local_70 + 0x10;
  local_70._8_8_ = 0;
  local_70._16_4_ = L'\0';
  local_70._0_8_ = lVar2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  switch(type) {
  case Open:
    getFullPathName(&local_90,
                    &((args->entries).
                      super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                      _M_impl.super__Vector_impl_data._M_start)->text);
    std::__cxx11::wstring::operator=((wstring *)local_70,(wstring *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    strFilename = (pointer)local_70;
    bVar3 = fileExists((wstring *)strFilename);
    if (!bVar3) {
LAB_001400f7:
      text = L"File %s not found";
LAB_00140117:
      Logger::printError<std::__cxx11::wstring>(FatalError,text,&strFilename->text);
      goto switchD_0013ff2f_caseD_3;
    }
    bVar3 = ConvertExpression(&(args->entries).
                               super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].text,(int *)&local_94);
    if (!bVar3) goto LAB_00140100;
    this_00 = (GenericAssemblerFile *)operator_new(0xa0);
    GenericAssemblerFile::GenericAssemblerFile(this_00,(wstring *)local_70,local_94,false);
    break;
  case Create:
    getFullPathName(&local_90,
                    &((args->entries).
                      super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                      _M_impl.super__Vector_impl_data._M_start)->text);
    std::__cxx11::wstring::operator=((wstring *)local_70,(wstring *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    bVar3 = ConvertExpression(&(args->entries).
                               super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].text,(int *)&local_94);
    if (!bVar3) {
LAB_00140100:
      strFilename = (args->entries).
                    super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
LAB_00140110:
      text = L"Invalid ram address %s";
      goto LAB_00140117;
    }
    this_00 = (GenericAssemblerFile *)operator_new(0xa0);
    GenericAssemblerFile::GenericAssemblerFile(this_00,(wstring *)local_70,local_94,true);
    break;
  case Copy:
    getFullPathName(&local_90,
                    &((args->entries).
                      super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                      _M_impl.super__Vector_impl_data._M_start)->text);
    std::__cxx11::wstring::operator=((wstring *)&local_50,(wstring *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    getFullPathName(&local_90,
                    &(args->entries).
                     super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].text);
    std::__cxx11::wstring::operator=((wstring *)local_70,(wstring *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    strFilename = (pointer)&local_50;
    bVar3 = fileExists((wstring *)strFilename);
    if (!bVar3) goto LAB_001400f7;
    bVar3 = ConvertExpression(&(args->entries).
                               super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].text,(int *)&local_94);
    if (!bVar3) {
      strFilename = (args->entries).
                    super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_start + 2;
      goto LAB_00140110;
    }
    this_00 = (GenericAssemblerFile *)operator_new(0xa0);
    GenericAssemblerFile::GenericAssemblerFile(this_00,(wstring *)local_70,&local_50,local_94);
    break;
  case Close:
    goto switchD_0013ff2f_caseD_3;
  default:
    goto switchD_0013ff2f_default;
  }
  this->file = this_00;
switchD_0013ff2f_default:
  FileManager::addFile(g_fileManager,&this->file->super_AssemblerFile);
  Global.Section = Global.Section + 1;
switchD_0013ff2f_caseD_3:
  if (local_70._0_8_ != lVar2) {
    operator_delete((void *)local_70._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

CDirectiveFile::CDirectiveFile(Type type, ArgumentList& args)
	: type(type)
{
	file = NULL;
	
	std::wstring originalName;
	std::wstring fileName;
	int virtualAddress;

	switch (type)
	{
	case Type::Open:
		fileName = getFullPathName(args[0].text);

		if (fileExists(fileName) == false)
		{
			Logger::printError(Logger::FatalError,L"File %s not found",fileName);
			return;
		}
		if (ConvertExpression(args[1].text,virtualAddress) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid ram address %s",args[1].text);
			return;
		}

		file = new GenericAssemblerFile(fileName,virtualAddress,false);
		break;
	case Type::Create:
		fileName = getFullPathName(args[0].text);

		if (ConvertExpression(args[1].text,virtualAddress) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid ram address %s",args[1].text);
			return;
		}

		file = new GenericAssemblerFile(fileName,virtualAddress,true);
		break;
	case Type::Copy:
		originalName = getFullPathName(args[0].text);
		fileName = getFullPathName(args[1].text);

		if (fileExists(originalName) == false)
		{
			Logger::printError(Logger::FatalError,L"File %s not found",originalName);
			return;
		}
		if (ConvertExpression(args[2].text,virtualAddress) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid ram address %s",args[2].text);
			return;
		}

		file = new GenericAssemblerFile(fileName,originalName,virtualAddress);
		break;
	case Type::Close:
		return;
	}

	g_fileManager->addFile(file);
	Global.Section++;
}